

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManPrintVerbose(Aig_Man_t *p,int fHaig)

{
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pObj;
  int iVar1;
  int fHaig_00;
  
  printf("PIs: ");
  for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
    Vec_PtrEntry(p->vCis,iVar1);
    printf(" %p");
  }
  putchar(10);
  p_00 = Aig_ManDfs(p,0);
  for (iVar1 = 0; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
    fHaig_00 = iVar1;
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar1);
    Aig_ObjPrintVerbose(pObj,fHaig_00);
    putchar(10);
  }
  putchar(10);
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Aig_ManPrintVerbose( Aig_Man_t * p, int fHaig )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    printf( "PIs: " );
    Aig_ManForEachCi( p, pObj, i )
        printf( " %p", pObj );
    printf( "\n" );
    vNodes = Aig_ManDfs( p, 0 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ObjPrintVerbose( pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_PtrFree( vNodes );
}